

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_consume_connection(nghttp2_session *session,size_t size)

{
  int iVar1;
  
  iVar1 = -0x207;
  if ((session->opt_flags & 1) != 0) {
    iVar1 = session_update_consumed_size
                      (session,&session->consumed_size,&session->recv_window_size,
                       session->window_update_queued,0,size,session->local_window_size);
    if (-0x385 < iVar1) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_consume_connection(nghttp2_session *session, size_t size) {
  int rv;

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}